

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O1

void * lj_ccallback_new(CTState *cts,CType *ct,GCfunc *fn)

{
  ushort uVar1;
  ushort uVar2;
  undefined4 uVar3;
  CType *pCVar4;
  CType *pCVar5;
  GCtab *t;
  bool bVar6;
  undefined8 *__addr;
  CTypeID1 *p;
  TValue *pTVar7;
  void *pvVar8;
  ulong uVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  CType *pCVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  GCobj *o;
  MSize MVar16;
  ulong uVar17;
  
  if (((ct->info & 0xf0000000) == 0x20000000) && (ct->size == 8)) {
    pCVar4 = cts->tab;
    uVar1 = (ushort)ct->info;
    pCVar5 = pCVar4 + uVar1;
    uVar15 = pCVar4[uVar1].info;
    if ((uVar15 & 0xf0000000) != 0x60000000) goto LAB_0011fc3d;
    uVar1 = (ushort)pCVar5->info;
    uVar2 = pCVar5->sib;
    uVar14 = pCVar4[uVar1].info >> 0x1c;
    if ((uVar14 < 6) && ((0x34U >> uVar14 & 1) != 0)) {
      if ((uVar15 >> 0x17 & 1) != 0) goto LAB_0011fc3d;
LAB_0011fb87:
      iVar13 = 0;
      for (; pCVar12 = pCVar5, uVar2 != 0; uVar2 = pCVar4[(uint)uVar2].sib) {
        uVar1 = (ushort)pCVar4[(uint)uVar2].info;
        uVar15 = pCVar4[uVar1].info >> 0x1c;
        if (((uVar15 == 2) || (uVar15 == 5)) ||
           ((pCVar4[uVar1].info < 0x10000000 && (pCVar4[uVar1].size < 9)))) {
          bVar6 = iVar13 < 0x10;
          iVar13 = iVar13 + 1;
        }
        else {
          bVar6 = false;
        }
        pCVar12 = (CType *)0x0;
        if (!bVar6) break;
      }
    }
    else {
      if (0xfffffff < pCVar4[uVar1].info) goto LAB_0011fc3d;
      pCVar12 = (CType *)0x0;
      if (((uVar15 >> 0x17 & 1) == 0) && (pCVar4[uVar1].size < 9)) goto LAB_0011fb87;
    }
  }
  else {
LAB_0011fc3d:
    pCVar12 = (CType *)0x0;
  }
  if (pCVar12 == (CType *)0x0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pCVar5 = cts->tab;
    p = (cts->cb).cbid;
    uVar15 = (cts->cb).topid;
    uVar17 = (ulong)uVar15;
    uVar14 = (cts->cb).sizeid;
    if (uVar15 < uVar14) {
      do {
        if (p[uVar17] == 0) goto LAB_0011fdb4;
        uVar17 = uVar17 + 1;
      } while (uVar14 != uVar17);
      uVar17 = (ulong)uVar14;
    }
    if (0x39f < (uint)uVar17) {
LAB_0011fe57:
      lj_err_caller(cts->L,LJ_ERR_FFI_CBACKOV);
    }
    if ((cts->cb).mcode == (void *)0x0) {
      uVar15 = 0;
      __addr = (undefined8 *)mmap64((void *)0x0,0x1000,3,0x22,-1,0);
      if (__addr == (undefined8 *)0xffffffffffffffff) goto LAB_0011fe57;
      (cts->cb).mcode = __addr;
      uVar3 = *(undefined4 *)&cts->g;
      *__addr = lj_vm_ffi_callback;
      puVar10 = __addr + 1;
      do {
        *(undefined1 *)puVar10 = 0xb0;
        *(char *)((long)puVar10 + 1) = (char)uVar15;
        if ((uVar15 & 0x1f) == 0x1f) {
          *(undefined2 *)((long)puVar10 + 2) = 0xb455;
          *(char *)((long)puVar10 + 4) = (char)(uVar15 >> 8);
          *(undefined1 *)((long)puVar10 + 5) = 0xbd;
          *(undefined4 *)((long)puVar10 + 6) = uVar3;
          *(undefined2 *)((long)puVar10 + 10) = 0x25ff;
          puVar11 = puVar10 + 2;
          *(int *)((long)puVar10 + 0xc) = (int)__addr - (int)puVar11;
        }
        else {
          *(undefined1 *)((long)puVar10 + 2) = 0xeb;
          *(byte *)((long)puVar10 + 3) = ((char)(uVar15 & 0x1f) << 2 ^ 0x7cU) - 2;
          puVar11 = (undefined8 *)((long)puVar10 + 4);
        }
        uVar15 = uVar15 + 1;
        puVar10 = puVar11;
      } while (uVar15 != 0x3a0);
      mprotect(__addr,0x1000,5);
    }
    uVar15 = (cts->cb).sizeid * 2;
    MVar16 = 8;
    if (8 < uVar15) {
      MVar16 = uVar15;
    }
    if (0x39f < MVar16) {
      MVar16 = 0x3a0;
    }
    p = (CTypeID1 *)lj_mem_realloc(cts->L,p,uVar15,MVar16 * 2);
    (cts->cb).sizeid = MVar16;
    (cts->cb).cbid = p;
    memset(p + uVar17,0,(ulong)(MVar16 - (uint)uVar17) * 2);
LAB_0011fdb4:
    uVar15 = (uint)uVar17;
    p[uVar17 & 0xffffffff] = (CTypeID1)((uint)((int)pCVar12 - (int)pCVar5) >> 4);
    (cts->cb).topid = uVar15 + 1;
    t = cts->miscmap;
    if (uVar15 < t->asize) {
      pTVar7 = (TValue *)((ulong)(t->array).ptr32 + (long)(int)uVar15 * 8);
    }
    else {
      pTVar7 = lj_tab_setinth(cts->L,t,uVar15);
    }
    (pTVar7->u32).lo = (uint32_t)fn;
    (pTVar7->field_2).it = 0xfffffff7;
    if ((t->marked & 4) != 0) {
      uVar9 = (ulong)(cts->L->glref).ptr32;
      t->marked = t->marked & 0xfb;
      (t->gclist).gcptr32 = *(uint32_t *)(uVar9 + 0x3c);
      *(int *)(uVar9 + 0x3c) = (int)t;
    }
    pvVar8 = (void *)((ulong)(((uint)(uVar17 >> 5) & 0x7ffffff) * 0xc + uVar15 * 4 + 8) +
                     (long)(cts->cb).mcode);
  }
  return pvVar8;
}

Assistant:

void *lj_ccallback_new(CTState *cts, CType *ct, GCfunc *fn)
{
  ct = callback_checkfunc(cts, ct);
  if (ct) {
    MSize slot = callback_slot_new(cts, ct);
    GCtab *t = cts->miscmap;
    setfuncV(cts->L, lj_tab_setint(cts->L, t, (int32_t)slot), fn);
    lj_gc_anybarriert(cts->L, t);
    return callback_slot2ptr(cts, slot);
  }
  return NULL;  /* Bad conversion. */
}